

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

bool __thiscall
despot::HierarchyCPT::IsIdentityUnderConstraint(HierarchyCPT *this,NamedVar *var,int value)

{
  TabularCPT *pTVar1;
  char cVar2;
  undefined1 uVar3;
  pointer ppTVar5;
  ulong uVar6;
  int iVar4;
  
  if (*(this->super_CPT).super_Function.parents_.
       super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
       super__Vector_impl_data._M_start == var) {
    pTVar1 = (this->cpts_).
             super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>._M_impl
             .super__Vector_impl_data._M_start[value];
    uVar3 = (**(code **)((long)(pTVar1->super_CPT).super_Function._vptr_Function + 0x80))
                      (pTVar1,var,value);
    return (bool)uVar3;
  }
  ppTVar5 = (this->cpts_).
            super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->cpts_).super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>.
      _M_impl.super__Vector_impl_data._M_finish == ppTVar5) {
    cVar2 = '\x01';
  }
  else {
    uVar6 = 0;
    do {
      iVar4 = (*(ppTVar5[uVar6]->super_CPT).super_Function._vptr_Function[0x10])
                        (ppTVar5[uVar6],var,(ulong)(uint)value);
      cVar2 = (char)iVar4;
      if (cVar2 == '\0') {
        return (bool)'\0';
      }
      uVar6 = uVar6 + 1;
      ppTVar5 = (this->cpts_).
                super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->cpts_).
                                   super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5 >> 3))
    ;
  }
  return (bool)cVar2;
}

Assistant:

bool HierarchyCPT::IsIdentityUnderConstraint(const NamedVar* var,
	int value) const {
	if (var == parents_[0])
		return cpts_[value]->IsIdentityUnderConstraint(var, value);

	for (int i = 0; i < cpts_.size(); i++)
		if (!cpts_[i]->IsIdentityUnderConstraint(var, value))
			return false;
	return true;
}